

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O0

size_t spdlog::details::os::filesize(FILE *f)

{
  int iVar1;
  spdlog_ex *this;
  undefined8 uVar2;
  FILE *in_RDI;
  stat64 st;
  int fd;
  string *in_stack_fffffffffffffee8;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  stat64 local_d8;
  int local_44;
  undefined1 local_3d;
  
  if (in_RDI == (FILE *)0x0) {
    local_3d = 1;
    this = (spdlog_ex *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    spdlog_ex::spdlog_ex(this,in_stack_fffffffffffffee8);
    local_3d = 0;
    __cxa_throw(this,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
  }
  local_44 = fileno(in_RDI);
  iVar1 = fstat64(local_44,&local_d8);
  if (iVar1 == 0) {
    return local_d8.st_size;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  __errno_location();
  spdlog_ex::spdlog_ex((spdlog_ex *)st._32_8_,(string *)st._24_8_,st.st_nlink._4_4_);
  __cxa_throw(uVar2,&spdlog_ex::typeinfo,spdlog_ex::~spdlog_ex);
}

Assistant:

SPDLOG_INLINE size_t filesize(FILE *f)
{
    if (f == nullptr)
    {
        SPDLOG_THROW(spdlog_ex("Failed getting file size. fd is null"));
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
    int fd = ::_fileno(f);
#if _WIN64 // 64 bits
    __int64 ret = ::_filelengthi64(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }

#else // windows 32 bits
    long ret = ::_filelength(fd);
    if (ret >= 0)
    {
        return static_cast<size_t>(ret);
    }
#endif

#else // unix
// OpenBSD doesn't compile with :: before the fileno(..)
#if defined(__OpenBSD__)
    int fd = fileno(f);
#else
    int fd = ::fileno(f);
#endif
// 64 bits(but not in osx or cygwin, where fstat64 is deprecated)
#if (defined(__linux__) || defined(__sun) || defined(_AIX)) && (defined(__LP64__) || defined(_LP64))
    struct stat64 st;
    if (::fstat64(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#else // other unix or linux 32 bits or cygwin
    struct stat st;
    if (::fstat(fd, &st) == 0)
    {
        return static_cast<size_t>(st.st_size);
    }
#endif
#endif
    SPDLOG_THROW(spdlog_ex("Failed getting file size from fd", errno));
}